

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

int __thiscall Epoll::modify_event(Epoll *this,int fd,int state)

{
  FILE *__stream;
  undefined4 uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_2c [4];
  int ret;
  epoll_event ev;
  int state_local;
  int fd_local;
  Epoll *this_local;
  
  local_2c = (undefined1  [4])state;
  ret = fd;
  ev.data.fd = state;
  ev.data.u64._4_4_ = fd;
  iVar2 = epoll_ctl(this->_epfd,3,fd,(epoll_event *)local_2c);
  uVar1 = ev.data.u64._4_4_;
  __stream = _stderr;
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"%s(%d)-<%s>: epoll_ctl modify fd:%d failed! error: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Epoll.cpp"
            ,0x2d,"modify_event",(ulong)(uint)uVar1,pcVar4);
    fflush(_stderr);
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Epoll::modify_event(const int fd, const int state)
{
    struct epoll_event ev;
    ev.events = state;
    ev.data.fd = fd;
    int ret = epoll_ctl(_epfd, EPOLL_CTL_MOD, fd, &ev);
    if (ret < 0)
    {
        LOG_PRINT("epoll_ctl modify fd:%d failed! error: %s", fd, strerror(errno));
        // exit(EXIT_FAILURE);
        return -1;
    }

    return 0;
}